

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseReference(xmlParserCtxtPtr ctxt)

{
  charactersSAXFunc UNRECOVERED_JUMPTABLE_00;
  _xmlNode *p_Var1;
  _xmlNode *p_Var2;
  bool bVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlEntityPtr ent;
  referenceSAXFunc UNRECOVERED_JUMPTABLE;
  xmlNodePtr pxVar6;
  cdataBlockSAXFunc p_Var7;
  void *pvVar8;
  xmlNodePtr node;
  xmlChar out [16];
  xmlChar local_28 [16];
  
  pxVar5 = ctxt->input->cur;
  if (*pxVar5 == '&') {
    if (pxVar5[1] == '#') {
      iVar4 = xmlParseCharRef(ctxt);
      if (iVar4 != 0) {
        if (iVar4 < 0x80) {
          local_28[0] = (xmlChar)iVar4;
          iVar4 = 1;
        }
        else {
          iVar4 = xmlCopyCharMultiByte(local_28,iVar4);
        }
        local_28[iVar4] = '\0';
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
            (UNRECOVERED_JUMPTABLE_00 = ctxt->sax->characters,
            UNRECOVERED_JUMPTABLE_00 != (charactersSAXFunc)0x0)) && (ctxt->disableSAX == 0)) {
          (*UNRECOVERED_JUMPTABLE_00)(ctxt->userData,local_28,iVar4);
        }
      }
    }
    else {
      pxVar5 = xmlParseEntityRefInternal(ctxt);
      if (pxVar5 != (xmlChar *)0x0) {
        ent = xmlLookupGeneralEntity(ctxt,pxVar5,0);
        if (ent == (xmlEntityPtr)0x0) {
          if ((((ctxt->replaceEntities == 0) && (ctxt->sax != (_xmlSAXHandler *)0x0)) &&
              (ctxt->disableSAX == 0)) &&
             (UNRECOVERED_JUMPTABLE = ctxt->sax->reference,
             UNRECOVERED_JUMPTABLE != (referenceSAXFunc)0x0)) {
            pvVar8 = ctxt->userData;
LAB_0013aaae:
            (*UNRECOVERED_JUMPTABLE)(pvVar8,pxVar5);
            return;
          }
        }
        else if (ctxt->wellFormed != 0) {
          if ((ent->name == (xmlChar *)0x0) || (ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
            pxVar5 = ent->content;
            if (((pxVar5 != (xmlChar *)0x0) &&
                ((ctxt->sax != (_xmlSAXHandler *)0x0 &&
                 (UNRECOVERED_JUMPTABLE_00 = ctxt->sax->characters,
                 UNRECOVERED_JUMPTABLE_00 != (charactersSAXFunc)0x0)))) && (ctxt->disableSAX == 0))
            {
              pvVar8 = ctxt->userData;
              iVar4 = xmlStrlen(pxVar5);
              (*UNRECOVERED_JUMPTABLE_00)(pvVar8,pxVar5,iVar4);
              return;
            }
          }
          else {
            if (((ent->flags & 1U) == 0) && (ent->children != (_xmlNode *)0x0)) {
              ent->flags = ent->flags | 1;
            }
            if (((ent->etype == XML_INTERNAL_GENERAL_ENTITY) ||
                (((ctxt->options & 0x800000) == 0 &&
                 ((ctxt->replaceEntities != 0 || (ctxt->validate != 0)))))) &&
               (((ent->flags & 1) == 0 || (ent->children == (_xmlNode *)0x0)))) {
              xmlCtxtParseEntity(ctxt,ent);
            }
            iVar4 = xmlParserEntityCheck(ctxt,ent->expandedSize);
            if (((iVar4 == 0) && (ctxt->sax != (_xmlSAXHandler *)0x0)) && (ctxt->disableSAX == 0)) {
              if (ctxt->replaceEntities == 0) {
                UNRECOVERED_JUMPTABLE = ctxt->sax->reference;
                if (UNRECOVERED_JUMPTABLE != (referenceSAXFunc)0x0) {
                  pvVar8 = ctxt->userData;
                  pxVar5 = ent->name;
                  goto LAB_0013aaae;
                }
              }
              else {
                node = ent->children;
                if ((node != (_xmlNode *)0x0) && (ctxt->node != (xmlNodePtr)0x0)) {
                  if (node->type - XML_TEXT_NODE < 2) {
                    iVar4 = xmlStrlen(node->content);
                    if ((node->type == XML_TEXT_NODE) || ((ctxt->options & 0x4000) != 0)) {
                      p_Var7 = ctxt->sax->characters;
                    }
                    else {
                      p_Var7 = ctxt->sax->cdataBlock;
                    }
                    if (p_Var7 != (cdataBlockSAXFunc)0x0) {
                      (*p_Var7)(ctxt,node->content,iVar4);
                    }
                    node = node->next;
                  }
                  do {
                    if (node == (xmlNodePtr)0x0) {
                      return;
                    }
                    if ((node->next == (_xmlNode *)0x0) && (node->type - XML_TEXT_NODE < 2)) {
                      iVar4 = xmlStrlen(node->content);
                      if ((node->type == XML_TEXT_NODE) || ((ctxt->options & 0x4000) != 0)) {
                        p_Var7 = ctxt->sax->characters;
                      }
                      else {
                        p_Var7 = ctxt->sax->cdataBlock;
                      }
                      if (p_Var7 != (cdataBlockSAXFunc)0x0) {
                        (*p_Var7)(ctxt,node->content,iVar4);
                      }
LAB_0013ac88:
                      bVar3 = false;
                    }
                    else {
                      ctxt->nodelen = 0;
                      ctxt->nodemem = 0;
                      pxVar6 = xmlDocCopyNode(node,ctxt->myDoc,1);
                      if (pxVar6 == (xmlNodePtr)0x0) {
                        xmlCtxtErrMemory(ctxt);
                        goto LAB_0013ac88;
                      }
                      if (ctxt->parseMode == XML_PARSE_READER) {
                        pxVar6->extra = node->extra;
                        pxVar6->_private = node->_private;
                      }
                      p_Var1 = ctxt->node;
                      pxVar6->parent = p_Var1;
                      p_Var2 = p_Var1->last;
                      if (p_Var2 == (_xmlNode *)0x0) {
                        p_Var1->children = pxVar6;
                      }
                      else {
                        p_Var2->next = pxVar6;
                        pxVar6->prev = p_Var2;
                      }
                      p_Var1->last = pxVar6;
                      node = node->next;
                      bVar3 = true;
                    }
                  } while (bVar3);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlParseReference(xmlParserCtxtPtr ctxt) {
    xmlEntityPtr ent = NULL;
    const xmlChar *name;
    xmlChar *val;

    if (RAW != '&')
        return;

    /*
     * Simple case of a CharRef
     */
    if (NXT(1) == '#') {
	int i = 0;
	xmlChar out[16];
	int value = xmlParseCharRef(ctxt);

	if (value == 0)
	    return;

        /*
         * Just encode the value in UTF-8
         */
        COPY_BUF(out, i, value);
        out[i] = 0;
        if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL) &&
            (!ctxt->disableSAX))
            ctxt->sax->characters(ctxt->userData, out, i);
	return;
    }

    /*
     * We are seeing an entity reference
     */
    name = xmlParseEntityRefInternal(ctxt);
    if (name == NULL)
        return;
    ent = xmlLookupGeneralEntity(ctxt, name, /* isAttr */ 0);
    if (ent == NULL) {
        /*
         * Create a reference for undeclared entities.
         */
        if ((ctxt->replaceEntities == 0) &&
            (ctxt->sax != NULL) &&
            (ctxt->disableSAX == 0) &&
            (ctxt->sax->reference != NULL)) {
            ctxt->sax->reference(ctxt->userData, name);
        }
        return;
    }
    if (!ctxt->wellFormed)
	return;

    /* special case of predefined entities */
    if ((ent->name == NULL) ||
        (ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
	val = ent->content;
	if (val == NULL) return;
	/*
	 * inline the entity.
	 */
	if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->characters(ctxt->userData, val, xmlStrlen(val));
	return;
    }

    /*
     * Some users try to parse entities on their own and used to set
     * the renamed "checked" member. Fix the flags to cover this
     * case.
     */
    if (((ent->flags & XML_ENT_PARSED) == 0) && (ent->children != NULL))
        ent->flags |= XML_ENT_PARSED;

    /*
     * The first reference to the entity trigger a parsing phase
     * where the ent->children is filled with the result from
     * the parsing.
     * Note: external parsed entities will not be loaded, it is not
     * required for a non-validating parser, unless the parsing option
     * of validating, or substituting entities were given. Doing so is
     * far more secure as the parser will only process data coming from
     * the document entity by default.
     *
     * FIXME: This doesn't work correctly since entities can be
     * expanded with different namespace declarations in scope.
     * For example:
     *
     * <!DOCTYPE doc [
     *   <!ENTITY ent "<ns:elem/>">
     * ]>
     * <doc>
     *   <decl1 xmlns:ns="urn:ns1">
     *     &ent;
     *   </decl1>
     *   <decl2 xmlns:ns="urn:ns2">
     *     &ent;
     *   </decl2>
     * </doc>
     *
     * Proposed fix:
     *
     * - Ignore current namespace declarations when parsing the
     *   entity. If a prefix can't be resolved, don't report an error
     *   but mark it as unresolved.
     * - Try to resolve these prefixes when expanding the entity.
     *   This will require a specialized version of xmlStaticCopyNode
     *   which can also make use of the namespace hash table to avoid
     *   quadratic behavior.
     *
     * Alternatively, we could simply reparse the entity on each
     * expansion like we already do with custom SAX callbacks.
     * External entity content should be cached in this case.
     */
    if ((ent->etype == XML_INTERNAL_GENERAL_ENTITY) ||
        (((ctxt->options & XML_PARSE_NO_XXE) == 0) &&
         ((ctxt->replaceEntities) ||
          (ctxt->validate)))) {
        if ((ent->flags & XML_ENT_PARSED) == 0) {
            xmlCtxtParseEntity(ctxt, ent);
        } else if (ent->children == NULL) {
            /*
             * Probably running in SAX mode and the callbacks don't
             * build the entity content. Parse the entity again.
             *
             * This will also be triggered in normal tree builder mode
             * if an entity happens to be empty, causing unnecessary
             * reloads. It's hard to come up with a reliable check in
             * which mode we're running.
             */
            xmlCtxtParseEntity(ctxt, ent);
        }
    }

    /*
     * We also check for amplification if entities aren't substituted.
     * They might be expanded later.
     */
    if (xmlParserEntityCheck(ctxt, ent->expandedSize))
        return;

    if ((ctxt->sax == NULL) || (ctxt->disableSAX))
        return;

    if (ctxt->replaceEntities == 0) {
	/*
	 * Create a reference
	 */
        if (ctxt->sax->reference != NULL)
	    ctxt->sax->reference(ctxt->userData, ent->name);
    } else if ((ent->children != NULL) && (ctxt->node != NULL)) {
        xmlNodePtr copy, cur;

        /*
         * Seems we are generating the DOM content, copy the tree
	 */
        cur = ent->children;

        /*
         * Handle first text node with SAX to coalesce text efficiently
         */
        if ((cur->type == XML_TEXT_NODE) ||
            (cur->type == XML_CDATA_SECTION_NODE)) {
            int len = xmlStrlen(cur->content);

            if ((cur->type == XML_TEXT_NODE) ||
                (ctxt->options & XML_PARSE_NOCDATA)) {
                if (ctxt->sax->characters != NULL)
                    ctxt->sax->characters(ctxt, cur->content, len);
            } else {
                if (ctxt->sax->cdataBlock != NULL)
                    ctxt->sax->cdataBlock(ctxt, cur->content, len);
            }

            cur = cur->next;
        }

        while (cur != NULL) {
            xmlNodePtr last;

            /*
             * Handle last text node with SAX to coalesce text efficiently
             */
            if ((cur->next == NULL) &&
                ((cur->type == XML_TEXT_NODE) ||
                 (cur->type == XML_CDATA_SECTION_NODE))) {
                int len = xmlStrlen(cur->content);

                if ((cur->type == XML_TEXT_NODE) ||
                    (ctxt->options & XML_PARSE_NOCDATA)) {
                    if (ctxt->sax->characters != NULL)
                        ctxt->sax->characters(ctxt, cur->content, len);
                } else {
                    if (ctxt->sax->cdataBlock != NULL)
                        ctxt->sax->cdataBlock(ctxt, cur->content, len);
                }

                break;
            }

            /*
             * Reset coalesce buffer stats only for non-text nodes.
             */
            ctxt->nodemem = 0;
            ctxt->nodelen = 0;

            copy = xmlDocCopyNode(cur, ctxt->myDoc, 1);

            if (copy == NULL) {
                xmlErrMemory(ctxt);
                break;
            }

            if (ctxt->parseMode == XML_PARSE_READER) {
                /* Needed for reader */
                copy->extra = cur->extra;
                /* Maybe needed for reader */
                copy->_private = cur->_private;
            }

            copy->parent = ctxt->node;
            last = ctxt->node->last;
            if (last == NULL) {
                ctxt->node->children = copy;
            } else {
                last->next = copy;
                copy->prev = last;
            }
            ctxt->node->last = copy;

            cur = cur->next;
        }
    }
}